

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O2

int8_t __thiscall
icu_63::UnicodeString::compare(UnicodeString *this,ConstChar16Ptr *srcChars,int32_t srcLength)

{
  short sVar1;
  int8_t iVar2;
  int32_t length;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (this->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  iVar2 = doCompare(this,0,length,srcChars->p_,0,srcLength);
  return iVar2;
}

Assistant:

inline int8_t
UnicodeString::compare(ConstChar16Ptr srcChars,
               int32_t srcLength) const
{ return doCompare(0, length(), srcChars, 0, srcLength); }